

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTest::DyndepParserTest(DyndepParserTest *this)

{
  DyndepParserTest *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__DyndepParserTest_00262f90;
  State::State(&this->state_);
  VirtualFileSystem::VirtualFileSystem(&this->fs_);
  DyndepFile::DyndepFile(&this->dyndep_file_);
  return;
}

Assistant:

void AssertParse(const char* input) {
    DyndepParser parser(&state_, &fs_, &dyndep_file_);
    string err;
    EXPECT_TRUE(parser.ParseTest(input, &err));
    ASSERT_EQ("", err);
  }